

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<double,_std::allocator<double>_> *variable,
          string *value)

{
  iterator __position;
  char *res;
  double local_18;
  char *local_10;
  
  local_10 = (char *)0x0;
  local_18 = strtod((value->_M_dataplus)._M_p,&local_10);
  __position._M_current = *(double **)(variable + 8);
  if (__position._M_current == *(double **)(variable + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (variable,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    *(double **)(variable + 8) = __position._M_current + 1;
  }
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<double>* variable,
                                            const std::string& value)
{
  char* res = KWSYS_NULLPTR;
  variable->push_back(strtod(value.c_str(), &res));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}